

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int append(void)

{
  int iVar1;
  char *local_28;
  char *url;
  CURLU *urlp;
  int local_10;
  CURLUcode rc;
  int error;
  int i;
  
  local_10 = 0;
  rc = CURLUE_OK;
  while( true ) {
    if (append_list[(int)rc].in == (char *)0x0 || local_10 != 0) {
      return local_10;
    }
    url = (char *)curl_url();
    if (url == (char *)0x0) break;
    urlp._4_4_ = curl_url_set(url,0,append_list[(int)rc].in,append_list[(int)rc].urlflags);
    if (urlp._4_4_ == CURLUE_OK) {
      urlp._4_4_ = curl_url_set(url,8,append_list[(int)rc].q,append_list[(int)rc].qflags | 0x100);
    }
    else {
      local_10 = local_10 + 1;
    }
    if (local_10 == 0) {
      if (urlp._4_4_ == append_list[(int)rc].ucode) {
        if (append_list[(int)rc].ucode == CURLUE_OK) {
          urlp._4_4_ = curl_url_get(url,0,&local_28);
          if (urlp._4_4_ == CURLUE_OK) {
            iVar1 = checkurl(local_28,append_list[(int)rc].out);
            if (iVar1 != 0) {
              local_10 = local_10 + 1;
            }
            curl_free(local_28);
          }
          else {
            curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                          ,0x397,urlp._4_4_);
            local_10 = local_10 + 1;
          }
        }
      }
      else {
        curl_mfprintf(_stderr,"Append\nin: %s\nreturned %d (expected %d)\n",append_list[(int)rc].in,
                      urlp._4_4_,append_list[(int)rc].ucode);
        local_10 = local_10 + 1;
      }
    }
    curl_url_cleanup(url);
    rc = rc + CURLUE_BAD_HANDLE;
  }
  return local_10 + 1;
}

Assistant:

static int append(void)
{
  int i;
  int error = 0;
  for(i = 0; append_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      append_list[i].in,
                      append_list[i].urlflags);
    if(rc)
      error++;
    else
      rc = curl_url_set(urlp, CURLUPART_QUERY,
                        append_list[i].q,
                        append_list[i].qflags | CURLU_APPENDQUERY);
    if(error)
      ;
    else if(rc != append_list[i].ucode) {
      fprintf(stderr, "Append\nin: %s\nreturned %d (expected %d)\n",
              append_list[i].in, (int)rc, append_list[i].ucode);
      error++;
    }
    else if(append_list[i].ucode) {
      /* the expected error happened */
    }
    else {
      char *url;
      rc = curl_url_get(urlp, CURLUPART_URL, &url, 0);
      if(rc) {
        fprintf(stderr, "%s:%d Get URL returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else {
        if(checkurl(url, append_list[i].out)) {
          error++;
        }
        curl_free(url);
      }
    }
    curl_url_cleanup(urlp);
  }
  return error;
}